

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 HashmapCmpCallback3(jx9_hashmap_node *pA,jx9_hashmap_node *pB,void *pCmpData)

{
  sxi32 sVar1;
  int iNest;
  anon_union_8_3_18420de5_for_x local_98;
  ulong uStack_90;
  jx9_vm *local_88;
  jx9_vm *pjStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  anon_union_8_3_18420de5_for_x local_58;
  ulong uStack_50;
  jx9_vm *local_48;
  jx9_vm *pjStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (pCmpData == (void *)0x0) {
    sVar1 = HashmapNodeCmp(pA,pB,0);
  }
  else {
    local_88 = pA->pMap->pVm;
    local_58.rVal = 0.0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    uStack_50 = 0x20;
    local_98.rVal = 0.0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    uStack_90 = 0x20;
    pjStack_80 = local_88;
    local_48 = local_88;
    pjStack_40 = local_88;
    jx9HashmapExtractNodeValue
              ((jx9_hashmap_node *)local_88,(jx9_value *)(ulong)pA->nValIdx,(int)&local_58);
    iNest = 0;
    jx9HashmapExtractNodeValue
              ((jx9_hashmap_node *)pB->pMap->pVm,(jx9_value *)(ulong)pB->nValIdx,(int)&local_98);
    if ((int)pCmpData == 5) {
      if ((uStack_50 & 1) == 0) {
        jx9MemObjToString((jx9_value *)&local_58);
      }
      if ((uStack_90 & 1) == 0) {
        jx9MemObjToString((jx9_value *)&local_98);
      }
    }
    else {
      jx9MemObjToNumeric((jx9_value *)&local_58);
      jx9MemObjToNumeric((jx9_value *)&local_98);
    }
    sVar1 = jx9MemObjCmp((jx9_value *)&local_58,(jx9_value *)&local_98,0,iNest);
    jx9MemObjRelease((jx9_value *)&local_58);
    jx9MemObjRelease((jx9_value *)&local_98);
  }
  return -sVar1;
}

Assistant:

static sxi32 HashmapCmpCallback3(jx9_hashmap_node *pA, jx9_hashmap_node *pB, void *pCmpData)
{
	jx9_value sA, sB;
	sxi32 iFlags;
	int rc;
	if( pCmpData == 0 ){
		/* Perform a standard comparison */
		rc = HashmapNodeCmp(pA, pB, FALSE);
		return -rc;
	}
	iFlags = SX_PTR_TO_INT(pCmpData);
	/* Duplicate node values */
	jx9MemObjInit(pA->pMap->pVm, &sA);
	jx9MemObjInit(pA->pMap->pVm, &sB);
	jx9HashmapExtractNodeValue(pA, &sA, FALSE);
	jx9HashmapExtractNodeValue(pB, &sB, FALSE);
	if( iFlags == 5 ){
		/* String cast */
		if( (sA.iFlags & MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(&sA);
		}
		if( (sB.iFlags & MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(&sB);
		}
	}else{
		/* Numeric cast */
		jx9MemObjToNumeric(&sA);
		jx9MemObjToNumeric(&sB);
	}
	/* Perform the comparison */
	rc = jx9MemObjCmp(&sA, &sB, FALSE, 0);
	jx9MemObjRelease(&sA);
	jx9MemObjRelease(&sB);
	return -rc;
}